

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O0

void writeDualSolution<double>
               (SoPlexBase<double> *soplex,char *filename,NameSet *colnames,NameSet *rownames,
               bool real,bool rational,bool append)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  double *pdVar5;
  void *pvVar6;
  char *pcVar7;
  ostream *poVar8;
  _Ios_Openmode in_ESI;
  byte in_R8B;
  byte in_R9B;
  Real RVar9;
  double dVar10;
  byte in_stack_00000008;
  int i_5;
  VectorRational redcost_1;
  int i_4;
  int i_3;
  VectorRational dual_1;
  int i_2;
  VectorBase<double> redcost;
  int i_1;
  int i;
  VectorBase<double> dual;
  ofstream outfile;
  int printwidth;
  int printprec;
  SoPlexBase<double> *in_stack_fffffffffffff818;
  SoPlexBase<double> *in_stack_fffffffffffff820;
  SoPlexBase<double> *in_stack_fffffffffffff828;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffff830;
  ostream *in_stack_fffffffffffff868;
  ostream *in_stack_fffffffffffff870;
  ostream *in_stack_fffffffffffff878;
  ostream *in_stack_fffffffffffff8a8;
  ostream *in_stack_fffffffffffff8b0;
  undefined4 local_4dc;
  undefined1 local_4d8 [76];
  int local_48c;
  undefined4 local_46c;
  undefined1 local_468 [64];
  int local_428;
  int local_424;
  int local_420;
  undefined4 local_41c;
  undefined1 local_418 [76];
  int local_3cc;
  int local_3ac;
  int local_394;
  int local_390;
  int local_38c;
  int local_374;
  int local_354;
  int local_33c;
  int local_338;
  int local_334;
  int local_320;
  int local_31c;
  int local_304;
  int local_300;
  int local_2fc;
  int local_2e4;
  ostream local_2c8 [548];
  int local_a4;
  int local_a0;
  byte local_9b;
  byte local_9a;
  byte local_99;
  _Ios_Openmode local_88;
  undefined8 local_78;
  undefined8 local_70;
  undefined4 *local_68;
  undefined1 *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined4 *local_48;
  undefined1 *local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined4 *local_28;
  undefined1 *local_20;
  undefined4 *local_18;
  undefined4 *local_10;
  undefined4 *local_8;
  
  local_99 = in_R8B & 1;
  local_9a = in_R9B & 1;
  local_9b = in_stack_00000008 & 1;
  local_88 = in_ESI;
  ::soplex::SoPlexBase<double>::tolerances(in_stack_fffffffffffff818);
  peVar4 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x139732);
  RVar9 = ::soplex::Tolerances::epsilon(peVar4);
  dVar10 = log10(RVar9);
  local_a0 = (int)-dVar10;
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x139782);
  local_a4 = local_a0 + 10;
  std::ofstream::ofstream(local_2c8);
  if ((local_9b & 1) == 0) {
    std::ofstream::open((char *)local_2c8,local_88);
  }
  else {
    std::ofstream::open((char *)local_2c8,local_88);
  }
  if ((local_99 & 1) != 0) {
    ::soplex::SoPlexBase<double>::numRows((SoPlexBase<double> *)0x139840);
    ::soplex::VectorBase<double>::VectorBase
              ((VectorBase<double> *)in_stack_fffffffffffff830,
               (int)((ulong)in_stack_fffffffffffff828 >> 0x20));
    bVar2 = ::soplex::SoPlexBase<double>::getDualFarkas
                      (in_stack_fffffffffffff828,(VectorBase<double> *)in_stack_fffffffffffff820);
    if (bVar2) {
      std::operator<<(local_2c8,"\nDual ray (name, value):\n");
      for (local_2e4 = 0; iVar1 = local_2e4,
          iVar3 = ::soplex::SoPlexBase<double>::numRows((SoPlexBase<double> *)0x1398c9),
          iVar1 < iVar3; local_2e4 = local_2e4 + 1) {
        ::soplex::VectorBase<double>::operator[]
                  ((VectorBase<double> *)in_stack_fffffffffffff820,
                   (int)((ulong)in_stack_fffffffffffff818 >> 0x20));
        ::soplex::SoPlexBase<double>::tolerances(in_stack_fffffffffffff818);
        peVar4 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x139933);
        ::soplex::Tolerances::epsilon(peVar4);
        bVar2 = ::soplex::isNotZero<double,double>
                          ((double)in_stack_fffffffffffff820,(double)in_stack_fffffffffffff818);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x139973)
        ;
        if (bVar2) {
          pcVar7 = ::soplex::NameSet::operator[]
                             ((NameSet *)in_stack_fffffffffffff820,
                              (int)((ulong)in_stack_fffffffffffff818 >> 0x20));
          poVar8 = std::operator<<(local_2c8,pcVar7);
          poVar8 = std::operator<<(poVar8,"\t");
          local_2fc = (int)std::setw(local_a4);
          poVar8 = std::operator<<(poVar8,(_Setw)local_2fc);
          local_300 = (int)std::setprecision(local_a0);
          poVar8 = std::operator<<(poVar8,(_Setprecision)local_300);
          pdVar5 = ::soplex::VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffff820,
                              (int)((ulong)in_stack_fffffffffffff818 >> 0x20));
          pvVar6 = (void *)std::ostream::operator<<(poVar8,*pdVar5);
          std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
        }
      }
      poVar8 = std::operator<<(local_2c8,"All other entries are zero (within ");
      local_304 = (int)std::setprecision(1);
      poVar8 = std::operator<<(poVar8,(_Setprecision)local_304);
      pvVar6 = (void *)std::ostream::operator<<(poVar8,std::scientific);
      ::soplex::SoPlexBase<double>::tolerances(in_stack_fffffffffffff818);
      peVar4 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x139b73);
      RVar9 = ::soplex::Tolerances::epsilon(peVar4);
      poVar8 = (ostream *)std::ostream::operator<<(pvVar6,RVar9);
      local_31c = (int)std::setprecision(8);
      poVar8 = std::operator<<(poVar8,(_Setprecision)local_31c);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::fixed);
      poVar8 = std::operator<<(poVar8,").");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x139c34);
    }
    else {
      bVar2 = ::soplex::SoPlexBase<double>::isDualFeasible(in_stack_fffffffffffff820);
      if ((bVar2) &&
         (bVar2 = ::soplex::SoPlexBase<double>::getDual
                            (in_stack_fffffffffffff828,
                             (VectorBase<double> *)in_stack_fffffffffffff820), bVar2)) {
        std::operator<<(local_2c8,"\nDual solution (name, value):\n");
        for (local_320 = 0; iVar1 = local_320,
            iVar3 = ::soplex::SoPlexBase<double>::numRows((SoPlexBase<double> *)0x139cdf),
            iVar1 < iVar3; local_320 = local_320 + 1) {
          ::soplex::VectorBase<double>::operator[]
                    ((VectorBase<double> *)in_stack_fffffffffffff820,
                     (int)((ulong)in_stack_fffffffffffff818 >> 0x20));
          ::soplex::SoPlexBase<double>::tolerances(in_stack_fffffffffffff818);
          peVar4 = std::
                   __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x139d49);
          ::soplex::Tolerances::epsilon(peVar4);
          bVar2 = ::soplex::isNotZero<double,double>
                            ((double)in_stack_fffffffffffff820,(double)in_stack_fffffffffffff818);
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x139d89);
          if (bVar2) {
            pcVar7 = ::soplex::NameSet::operator[]
                               ((NameSet *)in_stack_fffffffffffff820,
                                (int)((ulong)in_stack_fffffffffffff818 >> 0x20));
            poVar8 = std::operator<<(local_2c8,pcVar7);
            poVar8 = std::operator<<(poVar8,"\t");
            local_334 = (int)std::setw(local_a4);
            poVar8 = std::operator<<(poVar8,(_Setw)local_334);
            local_338 = (int)std::setprecision(local_a0);
            poVar8 = std::operator<<(poVar8,(_Setprecision)local_338);
            pdVar5 = ::soplex::VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffff820,
                                (int)((ulong)in_stack_fffffffffffff818 >> 0x20));
            pvVar6 = (void *)std::ostream::operator<<(poVar8,*pdVar5);
            std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
          }
        }
        poVar8 = std::operator<<(local_2c8,"All other dual values are zero (within ");
        local_33c = (int)std::setprecision(1);
        poVar8 = std::operator<<(poVar8,(_Setprecision)local_33c);
        pvVar6 = (void *)std::ostream::operator<<(poVar8,std::scientific);
        ::soplex::SoPlexBase<double>::tolerances(in_stack_fffffffffffff818);
        peVar4 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x139f70);
        RVar9 = ::soplex::Tolerances::epsilon(peVar4);
        poVar8 = (ostream *)std::ostream::operator<<(pvVar6,RVar9);
        local_354 = (int)std::setprecision(8);
        poVar8 = std::operator<<(poVar8,(_Setprecision)local_354);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::fixed);
        poVar8 = std::operator<<(poVar8,").");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x13a031)
        ;
        ::soplex::SoPlexBase<double>::numCols((SoPlexBase<double> *)0x13a03e);
        ::soplex::VectorBase<double>::VectorBase
                  ((VectorBase<double> *)in_stack_fffffffffffff830,
                   (int)((ulong)in_stack_fffffffffffff828 >> 0x20));
        bVar2 = ::soplex::SoPlexBase<double>::getRedCost
                          (in_stack_fffffffffffff828,(VectorBase<double> *)in_stack_fffffffffffff820
                          );
        if (bVar2) {
          std::operator<<(local_2c8,"\nReduced costs (name, value):\n");
          for (local_374 = 0; iVar1 = local_374,
              iVar3 = ::soplex::SoPlexBase<double>::numCols((SoPlexBase<double> *)0x13a0c7),
              iVar1 < iVar3; local_374 = local_374 + 1) {
            ::soplex::VectorBase<double>::operator[]
                      ((VectorBase<double> *)in_stack_fffffffffffff820,
                       (int)((ulong)in_stack_fffffffffffff818 >> 0x20));
            ::soplex::SoPlexBase<double>::tolerances(in_stack_fffffffffffff818);
            peVar4 = std::
                     __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x13a131);
            ::soplex::Tolerances::epsilon(peVar4);
            bVar2 = ::soplex::isNotZero<double,double>
                              ((double)in_stack_fffffffffffff820,(double)in_stack_fffffffffffff818);
            std::shared_ptr<soplex::Tolerances>::~shared_ptr
                      ((shared_ptr<soplex::Tolerances> *)0x13a171);
            if (bVar2) {
              pcVar7 = ::soplex::NameSet::operator[]
                                 ((NameSet *)in_stack_fffffffffffff820,
                                  (int)((ulong)in_stack_fffffffffffff818 >> 0x20));
              poVar8 = std::operator<<(local_2c8,pcVar7);
              poVar8 = std::operator<<(poVar8,"\t");
              local_38c = (int)std::setw(local_a4);
              poVar8 = std::operator<<(poVar8,(_Setw)local_38c);
              local_390 = (int)std::setprecision(local_a0);
              poVar8 = std::operator<<(poVar8,(_Setprecision)local_390);
              pdVar5 = ::soplex::VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffff820,
                                  (int)((ulong)in_stack_fffffffffffff818 >> 0x20));
              pvVar6 = (void *)std::ostream::operator<<(poVar8,*pdVar5);
              std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
            }
          }
          poVar8 = std::operator<<(local_2c8,"All other reduced costs are zero (within ");
          local_394 = (int)std::setprecision(1);
          poVar8 = std::operator<<(poVar8,(_Setprecision)local_394);
          pvVar6 = (void *)std::ostream::operator<<(poVar8,std::scientific);
          ::soplex::SoPlexBase<double>::tolerances(in_stack_fffffffffffff818);
          peVar4 = std::
                   __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x13a397);
          RVar9 = ::soplex::Tolerances::epsilon(peVar4);
          poVar8 = (ostream *)std::ostream::operator<<(pvVar6,RVar9);
          local_3ac = (int)std::setprecision(8);
          poVar8 = std::operator<<(poVar8,(_Setprecision)local_3ac);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::fixed);
          poVar8 = std::operator<<(poVar8,").");
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x13a458);
        }
        ::soplex::VectorBase<double>::~VectorBase((VectorBase<double> *)0x13a48a);
      }
      else {
        std::operator<<(local_2c8,"No dual information available.\n");
      }
    }
    ::soplex::VectorBase<double>::~VectorBase((VectorBase<double> *)0x13a4c2);
  }
  if ((local_9a & 1) != 0) {
    ::soplex::SoPlexBase<double>::numRows((SoPlexBase<double> *)0x13a4f1);
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::VectorBase(in_stack_fffffffffffff830,(int)((ulong)in_stack_fffffffffffff828 >> 0x20));
    bVar2 = ::soplex::SoPlexBase<double>::getDualFarkasRational
                      (in_stack_fffffffffffff828,
                       (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff820);
    if (bVar2) {
      std::operator<<(local_2c8,"\nDual ray (name, value):\n");
      for (local_3cc = 0; iVar1 = local_3cc,
          iVar3 = ::soplex::SoPlexBase<double>::numRows((SoPlexBase<double> *)0x13a57a),
          iVar1 < iVar3; local_3cc = local_3cc + 1) {
        ::soplex::
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff820,(int)((ulong)in_stack_fffffffffffff818 >> 0x20));
        local_41c = 0;
        local_60 = local_418;
        local_68 = &local_41c;
        local_70 = 0;
        local_78 = 0;
        local_8 = local_68;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)in_stack_fffffffffffff878,(longlong *)in_stack_fffffffffffff870,
                   in_stack_fffffffffffff868);
        bVar2 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)in_stack_fffffffffffff818,
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x13a641);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x13a657);
        if (bVar2) {
          pcVar7 = ::soplex::NameSet::operator[]
                             ((NameSet *)in_stack_fffffffffffff820,
                              (int)((ulong)in_stack_fffffffffffff818 >> 0x20));
          poVar8 = std::operator<<(local_2c8,pcVar7);
          poVar8 = std::operator<<(poVar8,"\t");
          local_420 = (int)std::setw(local_a4);
          poVar8 = std::operator<<(poVar8,(_Setw)local_420);
          local_424 = (int)std::setprecision(local_a0);
          std::operator<<(poVar8,(_Setprecision)local_424);
          ::soplex::
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff820,(int)((ulong)in_stack_fffffffffffff818 >> 0x20))
          ;
          in_stack_fffffffffffff8b0 =
               boost::multiprecision::operator<<
                         (in_stack_fffffffffffff8b0,
                          (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                           *)in_stack_fffffffffffff8a8);
          std::ostream::operator<<(in_stack_fffffffffffff8b0,std::endl<char,std::char_traits<char>>)
          ;
        }
      }
      in_stack_fffffffffffff8a8 = std::operator<<(local_2c8,"All other entries are zero.");
      std::ostream::operator<<(in_stack_fffffffffffff8a8,std::endl<char,std::char_traits<char>>);
    }
    bVar2 = ::soplex::SoPlexBase<double>::isDualFeasible(in_stack_fffffffffffff820);
    if ((bVar2) &&
       (bVar2 = ::soplex::SoPlexBase<double>::getDualRational
                          (in_stack_fffffffffffff828,
                           (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            *)in_stack_fffffffffffff820), bVar2)) {
      std::operator<<(local_2c8,"\nDual solution (name, value):\n");
      for (local_428 = 0; iVar1 = local_428,
          iVar3 = ::soplex::SoPlexBase<double>::numRowsRational((SoPlexBase<double> *)0x13a877),
          iVar1 < iVar3; local_428 = local_428 + 1) {
        ::soplex::
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff820,(int)((ulong)in_stack_fffffffffffff818 >> 0x20));
        local_46c = 0;
        local_40 = local_468;
        local_48 = &local_46c;
        local_50 = 0;
        local_58 = 0;
        local_10 = local_48;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)in_stack_fffffffffffff878,(longlong *)in_stack_fffffffffffff870,
                   in_stack_fffffffffffff868);
        bVar2 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)in_stack_fffffffffffff818,
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x13a938);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x13a94b);
        if (bVar2) {
          pcVar7 = ::soplex::NameSet::operator[]
                             ((NameSet *)in_stack_fffffffffffff820,
                              (int)((ulong)in_stack_fffffffffffff818 >> 0x20));
          in_stack_fffffffffffff878 = std::operator<<(local_2c8,pcVar7);
          in_stack_fffffffffffff870 = std::operator<<(in_stack_fffffffffffff878,"\t");
          ::soplex::
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff820,(int)((ulong)in_stack_fffffffffffff818 >> 0x20))
          ;
          in_stack_fffffffffffff868 =
               boost::multiprecision::operator<<
                         (in_stack_fffffffffffff8b0,
                          (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                           *)in_stack_fffffffffffff8a8);
          std::ostream::operator<<(in_stack_fffffffffffff868,std::endl<char,std::char_traits<char>>)
          ;
        }
      }
      poVar8 = std::operator<<(local_2c8,"All other dual values are zero.");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      ::soplex::SoPlexBase<double>::numCols((SoPlexBase<double> *)0x13aa5a);
      ::soplex::
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::VectorBase(in_stack_fffffffffffff830,(int)((ulong)in_stack_fffffffffffff828 >> 0x20));
      bVar2 = ::soplex::SoPlexBase<double>::getRedCostRational
                        (in_stack_fffffffffffff828,(VectorRational *)in_stack_fffffffffffff820);
      if (bVar2) {
        std::operator<<(local_2c8,"\nReduced costs (name, value):\n");
        for (local_48c = 0; iVar1 = local_48c,
            iVar3 = ::soplex::SoPlexBase<double>::numCols((SoPlexBase<double> *)0x13aad4),
            iVar1 < iVar3; local_48c = local_48c + 1) {
          ::soplex::
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff820,(int)((ulong)in_stack_fffffffffffff818 >> 0x20))
          ;
          local_4dc = 0;
          local_20 = local_4d8;
          local_28 = &local_4dc;
          local_30 = 0;
          local_38 = 0;
          local_18 = local_28;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)in_stack_fffffffffffff878,(longlong *)in_stack_fffffffffffff870,
                     in_stack_fffffffffffff868);
          bVar2 = boost::multiprecision::operator!=
                            ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)in_stack_fffffffffffff818,
                             (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)0x13ab8c);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x13ab9f);
          if (bVar2) {
            pcVar7 = ::soplex::NameSet::operator[]
                               ((NameSet *)in_stack_fffffffffffff820,
                                (int)((ulong)in_stack_fffffffffffff818 >> 0x20));
            poVar8 = std::operator<<(local_2c8,pcVar7);
            std::operator<<(poVar8,"\t");
            ::soplex::
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          *)in_stack_fffffffffffff820,
                         (int)((ulong)in_stack_fffffffffffff818 >> 0x20));
            in_stack_fffffffffffff820 =
                 (SoPlexBase<double> *)
                 boost::multiprecision::operator<<
                           (in_stack_fffffffffffff8b0,
                            (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                             *)in_stack_fffffffffffff8a8);
            std::ostream::operator<<
                      (in_stack_fffffffffffff820,std::endl<char,std::char_traits<char>>);
          }
        }
        poVar8 = std::operator<<(local_2c8,"All other reduced costs are zero.");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      }
      ::soplex::
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)0x13acc1);
    }
    else {
      std::operator<<(local_2c8,"No dual (rational) solution available.\n");
    }
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)0x13acf7);
  }
  std::ofstream::~ofstream(local_2c8);
  return;
}

Assistant:

static
void writeDualSolution(SoPlexBase<R>& soplex, const char* filename, NameSet& colnames,
                       NameSet& rownames,
                       bool real = true, bool rational = false, bool append = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;

   std::ofstream outfile;

   if(append)
      outfile.open(filename, std::ios::app);
   else
      outfile.open(filename);

   if(real)
   {
      VectorBase<R> dual(soplex.numRows());

      if(soplex.getDualFarkas(dual))
      {
         outfile << "\nDual ray (name, value):\n";

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(isNotZero(dual[i], soplex.tolerances()->epsilon()))
            {
               outfile << rownames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << dual[i] << std::endl;
            }
         }

         outfile << "All other entries are zero (within "
                 << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                 << std::setprecision(8) << std::fixed << ")." << std::endl;
      }
      else if(soplex.isDualFeasible() && soplex.getDual(dual))
      {
         outfile << "\nDual solution (name, value):\n";

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(isNotZero(dual[i], soplex.tolerances()->epsilon()))
            {
               outfile << rownames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << dual[i] << std::endl;
            }
         }

         outfile << "All other dual values are zero (within "
                 << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                 << std::setprecision(8) << std::fixed << ")." << std::endl;

         VectorBase<R> redcost(soplex.numCols());

         if(soplex.getRedCost(redcost))
         {
            outfile << "\nReduced costs (name, value):\n";

            for(int i = 0; i < soplex.numCols(); ++i)
            {
               if(isNotZero(redcost[i], soplex.tolerances()->epsilon()))
               {
                  outfile << colnames[i] << "\t"
                          << std::setw(printwidth) << std::setprecision(printprec)
                          << redcost[i] << std::endl;
               }
            }

            outfile << "All other reduced costs are zero (within "
                    << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                    << std::setprecision(8) << std::fixed << ")." << std::endl;
         }
      }
      else
         outfile << "No dual information available.\n";
   }

   if(rational)
   {
      VectorRational dual(soplex.numRows());

      if(soplex.getDualFarkasRational(dual))
      {
         outfile << "\nDual ray (name, value):\n";

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(dual[i] != (Rational) 0)
            {
               outfile << rownames[i] << "\t"
                       << std::setw(printwidth)
                       << std::setprecision(printprec)
                       << dual[i] << std::endl;
            }
         }

         outfile << "All other entries are zero." << std::endl;
      }

      if(soplex.isDualFeasible() && soplex.getDualRational(dual))
      {
         outfile << "\nDual solution (name, value):\n";

         for(int i = 0; i < soplex.numRowsRational(); ++i)
         {
            if(dual[i] != (Rational) 0)
               outfile << rownames[i] << "\t" << dual[i] << std::endl;
         }

         outfile << "All other dual values are zero." << std::endl;

         VectorRational redcost(soplex.numCols());

         if(soplex.getRedCostRational(redcost))
         {
            outfile << "\nReduced costs (name, value):\n";

            for(int i = 0; i < soplex.numCols(); ++i)
            {
               if(redcost[i] != (Rational) 0)
                  outfile << colnames[i] << "\t" << redcost[i] << std::endl;
            }

            outfile << "All other reduced costs are zero." << std::endl;
         }
      }
      else
         outfile << "No dual (rational) solution available.\n";
   }
}